

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O2

int Min_CoverSuppVarNum(Min_Man_t *p,Min_Cube_t *pCover)

{
  uint *puVar1;
  int iVar2;
  ulong uVar3;
  Min_Cube_t *pMVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  
  if (pCover == (Min_Cube_t *)0x0) {
    iVar2 = 0;
  }
  else {
    for (uVar3 = 0; uVar5 = *(uint *)&pCover->field_0x8, pMVar4 = pCover,
        uVar3 < (uVar5 >> 10 & 0xfff); uVar3 = uVar3 + 1) {
      p->pTemp->uData[uVar3] = 0xffffffff;
    }
    for (; pMVar4 != (Min_Cube_t *)0x0; pMVar4 = pMVar4->pNext) {
      for (uVar3 = 0; uVar3 < (uVar5 >> 10 & 0xfff); uVar3 = uVar3 + 1) {
        puVar1 = p->pTemp->uData + uVar3;
        *puVar1 = *puVar1 & pMVar4->uData[uVar3];
        uVar5 = *(uint *)&pCover->field_0x8;
      }
    }
    bVar6 = 0;
    iVar2 = 0;
    for (uVar7 = 0; (uVar5 & 0x3ff) != uVar7; uVar7 = uVar7 + 1) {
      iVar2 = (iVar2 + 1) - (uint)((~(p->pTemp->uData[uVar7 >> 4] >> (bVar6 & 0x1e)) & 3) == 0);
      bVar6 = bVar6 + 2;
    }
  }
  return iVar2;
}

Assistant:

int Min_CoverSuppVarNum( Min_Man_t * p, Min_Cube_t * pCover )
{
    Min_Cube_t * pCube;
    int i, Counter;
    if ( pCover == NULL )
        return 0;
    // clean the cube
    for ( i = 0; i < (int)pCover->nWords; i++ )
        p->pTemp->uData[i]  = ~((unsigned)0);
    // add the bit data
    Min_CoverForEachCube( pCover, pCube )
        for ( i = 0; i < (int)pCover->nWords; i++ )
            p->pTemp->uData[i] &= pCube->uData[i];
    // count the vars
    Counter = 0;
    for ( i = 0; i < (int)pCover->nVars; i++ )
        Counter += ( Min_CubeGetVar(p->pTemp, i) != 3 );
    return Counter;
}